

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O3

void printMemRegImm(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  byte bVar2;
  cs_detail *pcVar3;
  uint uVar4;
  _Bool _Var5;
  MCOperand *pMVar6;
  ulong uVar7;
  char *fmt;
  uint uVar8;
  
  set_mem_access(MI,true);
  pMVar6 = MCInst_getOperand(MI,OpNo);
  _Var5 = MCOperand_isImm(pMVar6);
  if (_Var5) {
    pMVar6 = MCInst_getOperand(MI,OpNo);
    uVar7 = MCOperand_getImm(pMVar6);
    if ((uVar7 & 0xffff) != 0) {
      uVar8 = (uint)(short)uVar7;
      if ((short)uVar7 < 0) {
        uVar4 = -uVar8;
        if (uVar8 < 0xfffffff7) {
          fmt = "-0x%x";
        }
        else {
          fmt = "-%u";
        }
      }
      else {
        uVar4 = uVar8;
        if (uVar8 < 10) {
          fmt = "%u";
        }
        else {
          fmt = "0x%x";
        }
      }
      SStream_concat(O,fmt,(ulong)uVar4);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar3 = MI->flat_insn->detail;
        bVar2 = (pcVar3->field_6).x86.addr_size;
        if (MI->csh->doing_mem == true) {
          *(uint *)(pcVar3->groups + (ulong)bVar2 * 0x10 + 0x22) = uVar8;
        }
        else {
          puVar1 = pcVar3->groups + (ulong)bVar2 * 0x10 + 0x1a;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          pcVar3 = MI->flat_insn->detail;
          *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).x86.addr_size * 0x10 + 0x1e) = uVar8;
          puVar1 = &(MI->flat_insn->detail->field_6).x86.addr_size;
          *puVar1 = *puVar1 + '\x01';
        }
      }
    }
  }
  else {
    printOperand(MI,OpNo,O);
  }
  SStream_concat0(O,"(");
  pMVar6 = MCInst_getOperand(MI,OpNo + 1);
  uVar8 = MCOperand_getReg(pMVar6);
  if (uVar8 == 0x36) {
    SStream_concat0(O,"0");
  }
  else {
    printOperand(MI,OpNo + 1,O);
  }
  SStream_concat0(O,")");
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = false;
    puVar1 = &(MI->flat_insn->detail->field_6).x86.addr_size;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printMemRegImm(MCInst *MI, unsigned OpNo, SStream *O)
{
	set_mem_access(MI, true);

	printS16ImmOperand_Mem(MI, OpNo, O);

	SStream_concat0(O, "(");

	if (MCOperand_getReg(MCInst_getOperand(MI, OpNo + 1)) == PPC_R0)
		SStream_concat0(O, "0");
	else
		printOperand(MI, OpNo + 1, O);

	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}